

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayKernel.hh
# Opt level: O1

HalfedgeHandle __thiscall
OpenMesh::ArrayKernel::new_edge(ArrayKernel *this,VertexHandle _start_vh,VertexHandle _end_vh)

{
  pointer *ppEVar1;
  iterator __position;
  pointer ppBVar2;
  BaseProperty *pBVar3;
  int iVar4;
  EdgeHandle EVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Halfedge *pHVar6;
  pointer ppBVar7;
  Edge local_58;
  BaseHandle local_34;
  
  local_58.halfedges_[0].super_Halfedge_without_prev.face_handle_.super_BaseHandle.idx_ =
       (BaseHandle)-1;
  local_58.halfedges_[0].super_Halfedge_without_prev.vertex_handle_.super_BaseHandle.idx_ =
       (BaseHandle)-1;
  local_58.halfedges_[0].super_Halfedge_without_prev.next_halfedge_handle_.super_BaseHandle.idx_ =
       (BaseHandle)-1;
  local_58.halfedges_[0].prev_halfedge_handle_.super_BaseHandle.idx_ = (BaseHandle)-1;
  local_58.halfedges_[1].super_Halfedge_without_prev.face_handle_.super_BaseHandle.idx_ =
       (BaseHandle)-1;
  local_58.halfedges_[1].super_Halfedge_without_prev.vertex_handle_.super_BaseHandle.idx_ =
       (BaseHandle)-1;
  local_58.halfedges_[1].super_Halfedge_without_prev.next_halfedge_handle_.super_BaseHandle.idx_ =
       (BaseHandle)-1;
  local_58.halfedges_[1].prev_halfedge_handle_.super_BaseHandle.idx_ = (BaseHandle)-1;
  __position._M_current =
       (this->edges_).
       super__Vector_base<OpenMesh::ArrayItems::Edge,_std::allocator<OpenMesh::ArrayItems::Edge>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_34 = _start_vh.super_BaseHandle.idx_;
  if (__position._M_current ==
      (this->edges_).
      super__Vector_base<OpenMesh::ArrayItems::Edge,_std::allocator<OpenMesh::ArrayItems::Edge>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<OpenMesh::ArrayItems::Edge,_std::allocator<OpenMesh::ArrayItems::Edge>_>::
    _M_realloc_insert<OpenMesh::ArrayItems::Edge>(&this->edges_,__position,&local_58);
  }
  else {
    (__position._M_current)->halfedges_[1].super_Halfedge_without_prev.face_handle_.super_BaseHandle
    .idx_ = -1;
    (__position._M_current)->halfedges_[1].super_Halfedge_without_prev.vertex_handle_.
    super_BaseHandle.idx_ = -1;
    (__position._M_current)->halfedges_[1].super_Halfedge_without_prev.next_halfedge_handle_.
    super_BaseHandle.idx_ = -1;
    (__position._M_current)->halfedges_[1].prev_halfedge_handle_.super_BaseHandle.idx_ = -1;
    (__position._M_current)->halfedges_[0].super_Halfedge_without_prev.face_handle_.super_BaseHandle
    .idx_ = -1;
    (__position._M_current)->halfedges_[0].super_Halfedge_without_prev.vertex_handle_.
    super_BaseHandle.idx_ = -1;
    (__position._M_current)->halfedges_[0].super_Halfedge_without_prev.next_halfedge_handle_.
    super_BaseHandle.idx_ = -1;
    (__position._M_current)->halfedges_[0].prev_halfedge_handle_.super_BaseHandle.idx_ = -1;
    ppEVar1 = &(this->edges_).
               super__Vector_base<OpenMesh::ArrayItems::Edge,_std::allocator<OpenMesh::ArrayItems::Edge>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppEVar1 = *ppEVar1 + 1;
  }
  iVar4 = (*(this->super_BaseKernel)._vptr_BaseKernel[4])(this);
  ppBVar2 = (this->super_BaseKernel).eprops_.properties_.
            super__Vector_base<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppBVar7 = (this->super_BaseKernel).eprops_.properties_.
                 super__Vector_base<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppBVar7 != ppBVar2;
      ppBVar7 = ppBVar7 + 1) {
    pBVar3 = *ppBVar7;
    if (pBVar3 != (BaseProperty *)0x0) {
      (*pBVar3->_vptr_BaseProperty[3])(pBVar3,CONCAT44(extraout_var,iVar4));
    }
  }
  iVar4 = (*(this->super_BaseKernel)._vptr_BaseKernel[3])(this);
  ppBVar2 = (this->super_BaseKernel).hprops_.properties_.
            super__Vector_base<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppBVar7 = (this->super_BaseKernel).hprops_.properties_.
                 super__Vector_base<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppBVar7 != ppBVar2;
      ppBVar7 = ppBVar7 + 1) {
    pBVar3 = *ppBVar7;
    if (pBVar3 != (BaseProperty *)0x0) {
      (*pBVar3->_vptr_BaseProperty[3])(pBVar3,CONCAT44(extraout_var_00,iVar4));
    }
  }
  EVar5 = handle(this,(this->edges_).
                      super__Vector_base<OpenMesh::ArrayItems::Edge,_std::allocator<OpenMesh::ArrayItems::Edge>_>
                      ._M_impl.super__Vector_impl_data._M_finish + -1);
  pHVar6 = halfedge(this,(HalfedgeHandle)(EVar5.super_BaseHandle.idx_ * 2).idx_);
  (pHVar6->super_Halfedge_without_prev).vertex_handle_.super_BaseHandle.idx_ =
       (int)_end_vh.super_BaseHandle.idx_;
  pHVar6 = halfedge(this,(HalfedgeHandle)((int)EVar5.super_BaseHandle.idx_ * 2 + 1));
  (pHVar6->super_Halfedge_without_prev).vertex_handle_.super_BaseHandle.idx_ = local_34.idx_;
  return (BaseHandle)(BaseHandle)(EVar5.super_BaseHandle.idx_ * 2).idx_;
}

Assistant:

inline HalfedgeHandle new_edge(VertexHandle _start_vh, VertexHandle _end_vh)
  {
//     assert(_start_vh != _end_vh);
    edges_.push_back(Edge());
    eprops_resize(n_edges());//TODO:should it be push_back()?
    hprops_resize(n_halfedges());//TODO:should it be push_back()?

    EdgeHandle eh(handle(edges_.back()));
    HalfedgeHandle heh0(halfedge_handle(eh, 0));
    HalfedgeHandle heh1(halfedge_handle(eh, 1));
    set_vertex_handle(heh0, _end_vh);
    set_vertex_handle(heh1, _start_vh);
    return heh0;
  }